

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetworkList
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  char cVar1;
  ErrorCode EVar2;
  pointer pbVar3;
  Registry *this_00;
  bool bVar4;
  Status SVar5;
  Value *pVVar6;
  char *pcVar7;
  char *pcVar8;
  Interpreter *this_01;
  string *psVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  writer wVar10;
  pointer pbVar11;
  string *this_02;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  string local_348;
  writer write;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  networks;
  format_string_checker<char> local_2e8;
  Value local_2b8;
  json json;
  writer write_5;
  Expression retExpr;
  string_t local_240;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_220;
  undefined1 local_210 [40];
  undefined1 local_1e8 [64];
  undefined1 local_1a8 [40];
  undefined1 local_180 [40];
  undefined1 local_158 [40];
  undefined1 local_130 [40];
  undefined1 local_108 [40];
  undefined1 local_e0 [40];
  undefined1 local_b8 [40];
  Network nwk;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  retExpr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  retExpr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  retExpr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  persistent_storage::Network::Network(&nwk);
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  networks.
  super__Vector_base<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&json,(nullptr_t)0x0);
  ReParseMultiNetworkSyntax((Error *)local_210,this,aExpr,&retExpr);
  Value::Value(&local_2b8,(Error *)local_210);
  pVVar6 = Value::operator=(__return_storage_ptr__,&local_2b8);
  EVar2 = (pVVar6->mError).mCode;
  Value::~Value(&local_2b8);
  std::__cxx11::string::~string((string *)(local_210 + 8));
  if (EVar2 != kNone) goto LAB_0019efea;
  if ((ulong)((long)(this->mContext).mExportFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mContext).mExportFiles.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    if (0x20 < (ulong)((long)(this->mContext).mImportFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->mContext).mImportFiles.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      local_2e8._0_8_ = (ulong)(uint)local_2e8._4_4_ << 0x20;
      local_2e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "multiple files not allowed for --import";
      local_2e8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x27;
      local_2e8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_2e8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_2e8.parse_funcs_[0] = (parse_func)0x0;
      pcVar7 = "multiple files not allowed for --import";
      write.handler_ = &local_2e8;
      local_2e8.context_.types_ = local_2e8.types_;
      while (pcVar7 != "") {
        cVar1 = *pcVar7;
        pcVar8 = pcVar7;
        while (cVar1 != '{') {
          pcVar8 = pcVar8 + 1;
          if (pcVar8 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar7,"");
            goto LAB_0019ead7;
          }
          cVar1 = *pcVar8;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar7,pcVar8);
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar8,"",&local_2e8);
      }
LAB_0019ead7:
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_2e8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_348,(v10 *)"multiple files not allowed for --import",
                 (string_view)ZEXT816(0x27),args_00);
      this_02 = (string *)(local_e0 + 8);
      local_e0._0_4_ = kInvalidArgs;
      std::__cxx11::string::string(this_02,(string *)&local_348);
      Value::Value(&local_2b8,(Error *)local_e0);
      goto LAB_0019efbd;
    }
    pbVar11 = (this->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->mContext).mNwkAliases.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar3 == pbVar11) {
      psVar9 = (this->mContext).mDomAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = (this->mRegistry).
                super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if ((this->mContext).mDomAliases.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == psVar9) {
        SVar5 = persistent_storage::Registry::GetAllNetworks(this_00,&networks);
        if (kNotFound < SVar5) {
          local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffff00000000;
          local_2e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "Failed to find registry entity of type: network";
          local_2e8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2f;
          local_2e8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_2e8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
          local_2e8.parse_funcs_[0] = (parse_func)0x0;
          pcVar7 = "Failed to find registry entity of type: network";
          write.handler_ = &local_2e8;
          local_2e8.context_.types_ = local_2e8.types_;
          while (pcVar7 != "") {
            cVar1 = *pcVar7;
            pcVar8 = pcVar7;
            while (cVar1 != '{') {
              pcVar8 = pcVar8 + 1;
              if (pcVar8 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                writer::operator()(&write,pcVar7,"");
                goto LAB_0019f0e4;
              }
              cVar1 = *pcVar8;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                               (pcVar8,"",&local_2e8);
          }
LAB_0019f0e4:
          args_05.field_1.args_ = in_R9.args_;
          args_05.desc_ = (unsigned_long_long)&local_2e8;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_348,(v10 *)"Failed to find registry entity of type: network",
                     (string_view)ZEXT816(0x2f),args_05);
          local_158._0_4_ = kNotFound;
          std::__cxx11::string::string((string *)(local_158 + 8),(string *)&local_348);
          Value::Value(&local_2b8,(Error *)local_158);
          Value::operator=(__return_storage_ptr__,&local_2b8);
          Value::~Value(&local_2b8);
          std::__cxx11::string::~string((string *)(local_158 + 8));
          std::__cxx11::string::~string((string *)&local_348);
        }
      }
      else {
        SVar5 = persistent_storage::Registry::GetNetworksInDomain(this_00,psVar9,&networks);
        if (SVar5 != kSuccess) {
          local_2e8.types_[0] = string_type;
          local_2e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "failed to find networks in domain \'{}\'";
          local_2e8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x26;
          local_2e8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_2e8.context_.super_basic_format_parse_context<char>._20_4_ = 1;
          local_2e8.parse_funcs_[0] =
               ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar7 = "failed to find networks in domain \'{}\'";
          write.handler_ = &local_2e8;
          local_2e8.context_.types_ = local_2e8.types_;
          while (pcVar7 != "") {
            cVar1 = *pcVar7;
            pcVar8 = pcVar7;
            while (cVar1 != '{') {
              pcVar8 = pcVar8 + 1;
              if (pcVar8 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&write,pcVar7,"");
                goto LAB_0019ee66;
              }
              cVar1 = *pcVar8;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&write,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar8,"",&local_2e8);
          }
LAB_0019ee66:
          pbVar11 = (this->mContext).mDomAliases.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_2e8._0_8_ = (pbVar11->_M_dataplus)._M_p;
          local_2e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               (char *)pbVar11->_M_string_length;
          fmt.size_ = 0xd;
          fmt.data_ = (char *)0x26;
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)&local_2e8;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_348,(v10 *)"failed to find networks in domain \'{}\'",fmt,args_02);
          this_02 = (string *)(local_130 + 8);
          local_130._0_4_ = kNotFound;
          std::__cxx11::string::string(this_02,(string *)&local_348);
          Value::Value(&local_2b8,(Error *)local_130);
          goto LAB_0019efbd;
        }
      }
    }
    else {
      if ((this->mContext).mDomAliases.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->mContext).mDomAliases.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffff00000000;
        local_2e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "--nwk and --dom are mutually exclusive";
        local_2e8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x26;
        local_2e8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_2e8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
        local_2e8.parse_funcs_[0] = (parse_func)0x0;
        pcVar7 = "--nwk and --dom are mutually exclusive";
        write.handler_ = &local_2e8;
        local_2e8.context_.types_ = local_2e8.types_;
        while (pcVar7 != "") {
          cVar1 = *pcVar7;
          pcVar8 = pcVar7;
          while (cVar1 != '{') {
            pcVar8 = pcVar8 + 1;
            if (pcVar8 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&write,pcVar7,"");
              goto LAB_0019ebfb;
            }
            cVar1 = *pcVar8;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar7,pcVar8);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar8,"",&local_2e8);
        }
LAB_0019ebfb:
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)&local_2e8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_348,(v10 *)"--nwk and --dom are mutually exclusive",
                   (string_view)ZEXT816(0x26),args_01);
        this_02 = (string *)(local_108 + 8);
        local_108._0_4_ = kInvalidArgs;
        std::__cxx11::string::string(this_02,(string *)&local_348);
        Value::Value(&local_2b8,(Error *)local_108);
        goto LAB_0019efbd;
      }
      for (; pbVar11 != pbVar3; pbVar11 = pbVar11 + 1) {
        bVar4 = std::operator==(pbVar11,"all");
        if (((bVar4) || (bVar4 = std::operator==(pbVar11,"other"), bVar4)) &&
           ((long)(this->mContext).mNwkAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->mContext).mNwkAliases.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
          local_2e8.types_[0] = string_type;
          local_2e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "\'{}\' must not combine with any other network alias";
          local_2e8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x32;
          local_2e8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_2e8.context_.super_basic_format_parse_context<char>._20_4_ = 1;
          local_2e8.parse_funcs_[0] =
               ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar7 = "\'{}\' must not combine with any other network alias";
          write.handler_ = &local_2e8;
          local_2e8.context_.types_ = local_2e8.types_;
          while (pcVar7 != "") {
            cVar1 = *pcVar7;
            pcVar8 = pcVar7;
            while (cVar1 != '{') {
              pcVar8 = pcVar8 + 1;
              if (pcVar8 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&write,pcVar7,"");
                goto LAB_0019ef67;
              }
              cVar1 = *pcVar8;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&write,pcVar7,pcVar8);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                               (pcVar8,"",&local_2e8);
          }
LAB_0019ef67:
          local_2e8._0_8_ = (pbVar11->_M_dataplus)._M_p;
          local_2e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               (char *)pbVar11->_M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x32;
          args_03.field_1.args_ = in_R9.args_;
          args_03.desc_ = (unsigned_long_long)&local_2e8;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_348,(v10 *)"\'{}\' must not combine with any other network alias",fmt_00
                     ,args_03);
          this_02 = (string *)(local_180 + 8);
          local_180._0_4_ = kInvalidArgs;
          std::__cxx11::string::string(this_02,(string *)&local_348);
          Value::Value(&local_2b8,(Error *)local_180);
          goto LAB_0019efbd;
        }
      }
      write.handler_ = (format_string_checker<char> *)0x0;
      SVar5 = persistent_storage::Registry::GetNetworksByAliases
                        ((this->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(StringArray *)this,&networks,(StringArray *)&write);
      psVar9 = (string *)(local_1e8 + 0x20);
      for (wVar10 = write; wVar10.handler_ != (format_string_checker<char> *)0x0;
          wVar10.handler_ = (format_string_checker<char> *)&((wVar10.handler_)->context_).types_) {
        std::__cxx11::string::string((string *)psVar9,(string *)wVar10.handler_);
        this_01 = (Interpreter *)local_1e8;
        std::__cxx11::string::string
                  ((string *)local_1e8,"failed to resolve",(allocator *)&local_2b8);
        PrintNetworkMessage(this_01,psVar9,(string *)local_1e8,kYellow);
        std::__cxx11::string::~string((string *)local_1e8);
        std::__cxx11::string::~string((string *)psVar9);
      }
      if (SVar5 != kSuccess) {
        local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffff00000000;
        local_2e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "Failed to find registry entity of type: network";
        local_2e8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2f;
        local_2e8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_2e8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
        local_2e8.parse_funcs_[0] = (parse_func)0x0;
        pcVar7 = "Failed to find registry entity of type: network";
        local_2e8.context_.types_ = local_2e8.types_;
        write_5.handler_ = &local_2e8;
        while (pcVar7 != "") {
          cVar1 = *pcVar7;
          pcVar8 = pcVar7;
          while (cVar1 != '{') {
            pcVar8 = pcVar8 + 1;
            if (pcVar8 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
              writer::operator()(&write_5,pcVar7,"");
              goto LAB_0019f047;
            }
            cVar1 = *pcVar8;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write_5,pcVar7,pcVar8);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar8,"",&local_2e8);
        }
LAB_0019f047:
        args_04.field_1.args_ = in_R9.args_;
        args_04.desc_ = (unsigned_long_long)&local_2e8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_348,(v10 *)"Failed to find registry entity of type: network",
                   (string_view)ZEXT816(0x2f),args_04);
        local_1a8._0_4_ = kNotFound;
        std::__cxx11::string::string((string *)(local_1a8 + 8),(string *)&local_348);
        Value::Value(&local_2b8,(Error *)local_1a8);
        Value::operator=(__return_storage_ptr__,&local_2b8);
        Value::~Value(&local_2b8);
        std::__cxx11::string::~string((string *)(local_1a8 + 8));
        std::__cxx11::string::~string((string *)&local_348);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&write);
        goto LAB_0019efea;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&write);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>_&,_std::vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>,_0>
              (&local_220,&networks);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(&json,&local_220);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_220);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(&local_240,&json,4,' ',false,strict);
    Value::Value(&local_2b8,&local_240);
    Value::operator=(__return_storage_ptr__,&local_2b8);
    Value::~Value(&local_2b8);
    psVar9 = &local_240;
  }
  else {
    local_2e8._0_8_ = (ulong)(uint)local_2e8._4_4_ << 0x20;
    local_2e8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "multiple files not allowed for --export";
    local_2e8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x27;
    local_2e8.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_2e8.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_2e8.parse_funcs_[0] = (parse_func)0x0;
    pcVar7 = "multiple files not allowed for --export";
    write.handler_ = &local_2e8;
    local_2e8.context_.types_ = local_2e8.types_;
    while (pcVar7 != "") {
      cVar1 = *pcVar7;
      pcVar8 = pcVar7;
      while (cVar1 != '{') {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar7,"");
          goto LAB_0019e9f5;
        }
        cVar1 = *pcVar8;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar7,pcVar8);
      pcVar7 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar8,"",&local_2e8);
    }
LAB_0019e9f5:
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_2e8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_348,(v10 *)"multiple files not allowed for --export",
               (string_view)ZEXT816(0x27),args);
    this_02 = (string *)(local_b8 + 8);
    local_b8._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(this_02,(string *)&local_348);
    Value::Value(&local_2b8,(Error *)local_b8);
LAB_0019efbd:
    Value::operator=(__return_storage_ptr__,&local_2b8);
    Value::~Value(&local_2b8);
    std::__cxx11::string::~string(this_02);
    psVar9 = &local_348;
  }
  std::__cxx11::string::~string((string *)psVar9);
LAB_0019efea:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  std::
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  ::~vector(&networks);
  persistent_storage::Network::~Network(&nwk);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&retExpr);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetworkList(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Interpreter::Value   value;
    Expression           retExpr;
    Network              nwk{};
    std::vector<Network> networks;
    ::nlohmann::json     json;

    SuccessOrExit(value = ReParseMultiNetworkSyntax(aExpr, retExpr));
    // export file specification must be single or omitted
    VerifyOrExit(mContext.mExportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_EXPORT));
    // import file specification must be single or omitted
    VerifyOrExit(mContext.mImportFiles.size() < 2, value = ERROR_INVALID_ARGS(SYNTAX_MULTI_IMPORT));
    // network and domain must not be specified simultaneously
    VerifyOrExit(mContext.mNwkAliases.size() == 0 || mContext.mDomAliases.size() == 0,
                 value = ERROR_INVALID_ARGS(SYNTAX_NWK_DOM_MUTUAL));

    if (mContext.mDomAliases.size() > 0)
    {
        VerifyOrExit(mRegistry->GetNetworksInDomain(mContext.mDomAliases[0], networks) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("failed to find networks in domain '{}'", mContext.mDomAliases[0]));
    }
    else if (mContext.mNwkAliases.size() == 0)
    {
        RegistryStatus status = mRegistry->GetAllNetworks(networks);
        if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
        {
            value = ERROR_NOT_FOUND(NOT_FOUND_STR NETWORK_STR);
        }
    }
    else
    {
        // Quickly check group aliases
        for (const auto &alias : mContext.mNwkAliases)
        {
            if (alias == ALIAS_ALL || alias == ALIAS_OTHERS)
                VerifyOrExit(mContext.mNwkAliases.size() == 1, value = ERROR_INVALID_ARGS(SYNTAX_GROUP_ALIAS, alias));
        }

        StringArray    unresolved;
        RegistryStatus status = mRegistry->GetNetworksByAliases(mContext.mNwkAliases, networks, unresolved);
        for (const auto &alias : unresolved)
        {
            PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
        }
        VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_NOT_FOUND(NOT_FOUND_STR NETWORK_STR));
    }

    json  = networks;
    value = json.dump(JSON_INDENT_DEFAULT);

exit:
    return value;
}